

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memheap.cpp
# Opt level: O3

void * __thiscall CHeap::Allocate(CHeap *this,uint Size)

{
  char *pcVar1;
  CChunk *pCVar2;
  CChunk *pCVar3;
  CChunk *pCVar4;
  CChunk *pCVar5;
  
  pCVar4 = this->m_pCurrent;
  pCVar3 = (CChunk *)pCVar4->m_pCurrent;
  pcVar1 = (char *)((long)&pCVar3->m_pMemory + (ulong)Size);
  if ((pCVar4->m_pEnd < pcVar1) || (pCVar4->m_pCurrent = pcVar1, pCVar3 == (CChunk *)0x0)) {
    pCVar2 = (CChunk *)mem_alloc(0x10020);
    pCVar4 = this->m_pCurrent;
    if (pCVar2 == (CChunk *)0x0) {
      pCVar3 = (CChunk *)pCVar4->m_pCurrent;
      pCVar5 = (CChunk *)pCVar4->m_pEnd;
    }
    else {
      pCVar3 = pCVar2 + 1;
      pCVar2->m_pMemory = (char *)pCVar3;
      pCVar2->m_pCurrent = (char *)pCVar3;
      pCVar5 = pCVar2 + 0x801;
      pCVar2->m_pEnd = (char *)pCVar5;
      pCVar2->m_pNext = pCVar4;
      this->m_pCurrent = pCVar2;
      pCVar4 = pCVar2;
    }
    pCVar2 = (CChunk *)((long)&pCVar3->m_pMemory + (ulong)Size);
    if (pCVar5 < pCVar2) {
      pCVar3 = (CChunk *)0x0;
    }
    else {
      pCVar4->m_pCurrent = (char *)pCVar2;
    }
  }
  return pCVar3;
}

Assistant:

void *CHeap::Allocate(unsigned int Size)
{
	// try to allocate from current chunk
	char *pMem = (char *)AllocateFromChunk(Size);
	if(!pMem)
	{
		// allocate new chunk and add it to the heap
		NewChunk();

		// try to allocate again
		pMem = (char *)AllocateFromChunk(Size);
	}

	return pMem;
}